

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

void gray_set_cell(gray_PWorker worker,TCoord ex,TCoord ey)

{
  int iVar1;
  int local_34;
  PCell_conflict local_30;
  PCell_conflict cell;
  PCell_conflict *pcell;
  TCoord ey_index;
  TCoord ey_local;
  TCoord ex_local;
  gray_PWorker worker_local;
  
  iVar1 = ey - worker->min_ey;
  if (((iVar1 < 0) || (worker->count_ey <= iVar1)) || (worker->max_ex <= ex)) {
    worker->cell = worker->cell_null;
  }
  else {
    cell = (PCell_conflict)(worker->ycells + iVar1);
    local_34 = ex;
    if (ex <= worker->min_ex + -1) {
      local_34 = worker->min_ex + -1;
    }
    while (local_30 = *(PCell_conflict *)cell, local_30->x <= local_34) {
      if (local_30->x == local_34) goto LAB_0033e3c8;
      cell = (PCell_conflict)&local_30->next;
    }
    local_30 = worker->cell_free;
    worker->cell_free = local_30 + 1;
    if (worker->cell_null <= local_30) {
      longjmp((__jmp_buf_tag *)worker,1);
    }
    local_30->x = local_34;
    local_30->area = 0;
    local_30->cover = 0;
    local_30->next = *(PCell *)cell;
    *(PCell_conflict *)cell = local_30;
LAB_0033e3c8:
    worker->cell = local_30;
  }
  return;
}

Assistant:

static void
  gray_set_cell( RAS_ARG_ TCoord  ex,
                          TCoord  ey )
  {
    /* Move the cell pointer to a new position in the linked list. We use  */
    /* a dumpster null cell for everything outside of the clipping region  */
    /* during the render phase.  This means that:                          */
    /*                                                                     */
    /* . the new vertical position must be within min_ey..max_ey-1.        */
    /* . the new horizontal position must be strictly less than max_ex     */
    /*                                                                     */
    /* Note that if a cell is to the left of the clipping region, it is    */
    /* actually set to the (min_ex-1) horizontal position.                 */

    TCoord  ey_index = ey - ras.min_ey;


    if ( ey_index < 0 || ey_index >= ras.count_ey || ex >= ras.max_ex )
      ras.cell = ras.cell_null;
    else
    {
      PCell*  pcell = ras.ycells + ey_index;
      PCell   cell;


      ex = FT_MAX( ex, ras.min_ex - 1 );

      while ( 1 )
      {
        cell = *pcell;

        if ( cell->x > ex )
          break;

        if ( cell->x == ex )
          goto Found;

        pcell = &cell->next;
      }

      /* insert new cell */
      cell = ras.cell_free++;
      if ( cell >= ras.cell_null )
        ft_longjmp( ras.jump_buffer, 1 );

      cell->x     = ex;
      cell->area  = 0;
      cell->cover = 0;

      cell->next  = *pcell;
      *pcell      = cell;

    Found:
      ras.cell = cell;
    }
  }